

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O1

index __thiscall
boost::detail::multi_array::
multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
::
calculate_origin_offset<boost::array<long,3ul>,boost::array<unsigned_long,3ul>,boost::array<long,3ul>>
          (multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
           *this,array<long,_3UL> *stride_list,array<unsigned_long,_3UL> *extent_list,
          general_storage_order<3UL> *storage,array<long,_3UL> *index_base_list)

{
  undefined1 auVar1 [16];
  byte bVar2;
  long lVar3;
  byte bVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar9 [32];
  
  bVar2 = 1;
  lVar3 = -3;
  do {
    bVar2 = bVar2 & *(byte *)((long)(&storage->ascending_ + 1) + lVar3);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  if (bVar2 == 0) {
    auVar6 = vmovdqu8_avx512vl((storage->ascending_).elems[0]);
    auVar6 = vpsllw_avx(ZEXT316(auVar6._0_3_),7);
    uVar5 = vpmovb2m_avx512vl(auVar6);
    bVar4 = ~(byte)uVar5;
    bVar2 = bVar4 & 7;
    auVar8 = vmovdqu64_avx512vl(*(undefined1 (*) [32])extent_list);
    auVar11._8_8_ = (ulong)(bVar2 >> 1 & 1) * auVar8._8_8_;
    auVar11._0_8_ = (ulong)(bVar4 & 1) * auVar8._0_8_;
    auVar11._16_8_ = (ulong)(bVar2 >> 2) * auVar8._16_8_;
    auVar11._24_8_ = 0;
    auVar12._8_8_ = 1;
    auVar12._0_8_ = 1;
    auVar12._16_8_ = 1;
    auVar12._24_8_ = 1;
    auVar8 = vpsubq_avx2(auVar12,auVar11);
    auVar11 = vmovdqu64_avx512vl(*(undefined1 (*) [32])stride_list);
    auVar7._8_8_ = (ulong)(bVar2 >> 1 & 1) * auVar11._8_8_;
    auVar7._0_8_ = (ulong)(bVar4 & 1) * auVar11._0_8_;
    auVar7._16_8_ = (ulong)(bVar2 >> 2) * auVar11._16_8_;
    auVar7._24_8_ = 0;
    auVar8 = vpmullq_avx512vl(auVar8,auVar7);
    auVar6._8_8_ = (ulong)(bVar2 >> 1 & 1) * auVar8._8_8_;
    auVar6._0_8_ = (ulong)(bVar4 & 1) * auVar8._0_8_;
    auVar8._16_8_ = (ulong)(bVar2 >> 2) * auVar8._16_8_;
    auVar8._0_16_ = auVar6;
    auVar8._24_8_ = 0;
    auVar8 = vpblendd_avx2(auVar8,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xc0);
    auVar6 = vpaddq_avx(auVar6,auVar8._16_16_);
    auVar1 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpaddq_avx(auVar6,auVar1);
    lVar3 = auVar6._0_8_;
  }
  else {
    lVar3 = 0;
  }
  auVar8 = vmovdqu64_avx512vl(*(undefined1 (*) [32])index_base_list);
  auVar9._0_24_ = auVar8._0_24_;
  auVar9._24_8_ = 0;
  auVar8 = vmovdqu64_avx512vl(*(undefined1 (*) [32])stride_list);
  auVar10._0_24_ = auVar8._0_24_;
  auVar10._24_8_ = 0;
  auVar11 = vpmullq_avx512vl(auVar9,auVar10);
  auVar8 = vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar11);
  auVar8 = vpblendd_avx2(auVar8,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xc0);
  auVar1 = vpsubq_avx(auVar8._16_16_,auVar11._0_16_);
  auVar6 = vpshufd_avx(auVar1,0xee);
  auVar6 = vpaddq_avx(auVar1,auVar6);
  return auVar6._0_8_ + lVar3;
}

Assistant:

index
  calculate_origin_offset(const StrideList& stride_list,
                          const ExtentList& extent_list,
                          const general_storage_order<NumDims>& storage,
                          const BaseList& index_base_list)
  {
    return
      calculate_descending_dimension_offset(stride_list,extent_list,
                                            storage) +
      calculate_indexing_offset(stride_list,index_base_list);
  }